

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O3

void CVmObjBigNum::round_up_abs(char *ext,int keep_digits)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  
  if (keep_digits != 0) {
    uVar3 = (ulong)keep_digits;
    iVar5 = keep_digits * 4;
    do {
      iVar5 = iVar5 + -4;
      uVar3 = uVar3 - 1;
      uVar4 = uVar3 >> 1;
      bVar1 = ext[uVar4 + 5];
      uVar6 = (uint)(int)(char)bVar1 >> (~(byte)iVar5 & 4) & 0xf;
      if (uVar6 < 9) {
        bVar2 = (byte)uVar3 & 1;
        ext[uVar4 + 5] = (byte)(uVar6 + 1 << (bVar2 * '\x04' ^ 4)) | '\x0f' << (bVar2 << 2) & bVar1;
        goto LAB_002693c1;
      }
      ext[uVar4 + 5] = '\x0f' << ((byte)iVar5 & 4) & bVar1;
    } while (uVar3 != 0);
  }
  shift_right(ext,1);
  *(short *)(ext + 2) = *(short *)(ext + 2) + 1;
  ext[5] = ext[5] & 0xfU | 0x10;
LAB_002693c1:
  ext[4] = ext[4] & 0xf7;
  return;
}

Assistant:

void CVmObjBigNum::round_up_abs(char *ext, int keep_digits)
{
    /* start with a "carry" into the least significant digit */
    int carry = TRUE;

    /* propagate the carry through the number's digits */
    for (int idx = keep_digits ; idx != 0 ; )
    {
        /* move to the next more significant digit */
        --idx;

        /* add the carry */
        int d = get_dig(ext, idx);
        if (d < 9)
        {
            /* bump it up */
            set_dig(ext, idx, d + 1);

            /* no carrying required, so we can stop now */
            carry = FALSE;
            break;
        }
        else
        {
            /* it's a '9', so bump it up to '0' and carry to the next digit */
            set_dig(ext, idx, 0);
        }
    }

    /* 
     *   If we carried out of the top digit, we must have had all nines, in
     *   which case we now have all zeros.  Put a 1 in the first digit and
     *   increase the exponent to renormalize. 
     */
    if (carry)
    {
        /* shift the mantissa */
        shift_right(ext, 1);

        /* increase the exponent */
        set_exp(ext, get_exp(ext) + 1);
        
        /* set the lead digit to 1 */
        set_dig(ext, 0, 1);
    }

    /* we know the value is non-zero now */
    ext[VMBN_FLAGS] &= ~VMBN_F_ZERO;
}